

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

void hexTo(void *dest,char *src)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = strLen(src);
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 2) {
    *(octet *)dest = hex_dec_table[(byte)src[sVar2]] << 4 | hex_dec_table[(byte)src[sVar2 + 1]];
    dest = (void *)((long)dest + 1);
  }
  return;
}

Assistant:

void hexTo(void* dest, const char* src)
{
	size_t count;
	ASSERT(hexIsValid(src));
	ASSERT(memIsDisjoint2(src, strLen(src) + 1, dest, strLen(src) / 2));
	count = strLen(src);
	for (; count; count -= 2, src += 2, dest = (octet*)dest + 1)
		*(octet*)dest = hexToO(src);
}